

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

Status __thiscall
leveldb::Version::Get(Version *this,ReadOptions *options,LookupKey *k,string *value,GetStats *stats)

{
  Slice internal_key;
  undefined8 *in_R9;
  Slice local_108;
  Slice local_f8;
  ReadOptions *local_e8;
  char *local_e0;
  Comparator *local_d8;
  char *local_d0;
  Slice local_c8;
  Slice local_b8;
  undefined1 local_a8 [8];
  State state;
  GetStats *stats_local;
  string *value_local;
  LookupKey *k_local;
  ReadOptions *options_local;
  Version *this_local;
  
  *in_R9 = 0;
  *(undefined4 *)(in_R9 + 1) = 0xffffffff;
  state._104_8_ = in_R9;
  Get::State::State((State *)local_a8);
  state.s.state_._0_1_ = 0;
  state.saver.value = (string *)state._104_8_;
  state.ikey.size_ = 0;
  state.last_file_read._0_4_ = 0xffffffff;
  state.stats = (GetStats *)k;
  local_b8 = LookupKey::internal_key((LookupKey *)value);
  state.options = (ReadOptions *)local_b8.data_;
  state.ikey.data_ = (char *)local_b8.size_;
  state._80_8_ = *(undefined8 *)options;
  local_a8._0_4_ = kNotFound;
  state.saver._0_8_ =
       InternalKeyComparator::user_comparator((InternalKeyComparator *)(*(long *)options + 0x38));
  local_c8 = LookupKey::user_key((LookupKey *)value);
  state.saver.ucmp = (Comparator *)local_c8.data_;
  state.saver.user_key.data_ = (char *)local_c8.size_;
  local_d8 = (Comparator *)local_c8.data_;
  local_d0 = (char *)local_c8.size_;
  local_e8 = state.options;
  local_e0 = state.ikey.data_;
  internal_key.size_ = (size_t)state.ikey.data_;
  internal_key.data_ = &(state.options)->verify_checksums;
  state.saver.user_key.size_ = (size_t)stats;
  ForEachOverlapping((Version *)options,local_c8,internal_key,local_a8,
                     Get(leveldb::ReadOptions_const&,leveldb::LookupKey_const&,std::__cxx11::
                     string*,leveldb::Version::GetStats*)::State::Match(void*,int,leveldb::
                     FileMetaData__);
  if (((byte)state.s.state_ & 1) == 0) {
    Slice::Slice(&local_f8);
    Slice::Slice(&local_108);
    Status::NotFound((Status *)this,&local_f8,&local_108);
  }
  else {
    Status::Status((Status *)this,(Status *)&state.vset);
  }
  Get::State::~State((State *)local_a8);
  return (Status)(char *)this;
}

Assistant:

Status Version::Get(const ReadOptions& options, const LookupKey& k,
                    std::string* value, GetStats* stats) {
  stats->seek_file = nullptr;
  stats->seek_file_level = -1;

  struct State {
    Saver saver;
    GetStats* stats;
    const ReadOptions* options;
    Slice ikey;
    FileMetaData* last_file_read;
    int last_file_read_level;

    VersionSet* vset;
    Status s;
    bool found;

    static bool Match(void* arg, int level, FileMetaData* f) {
      State* state = reinterpret_cast<State*>(arg);

      if (state->stats->seek_file == nullptr &&
          state->last_file_read != nullptr) {
        // We have had more than one seek for this read.  Charge the 1st file.
        state->stats->seek_file = state->last_file_read;
        state->stats->seek_file_level = state->last_file_read_level;
      }

      state->last_file_read = f;
      state->last_file_read_level = level;

      state->s = state->vset->table_cache_->Get(*state->options, f->number,
                                                f->file_size, state->ikey,
                                                &state->saver, SaveValue);
      if (!state->s.ok()) {
        state->found = true;
        return false;
      }
      switch (state->saver.state) {
        case kNotFound:
          return true;  // Keep searching in other files
        case kFound:
          state->found = true;
          return false;
        case kDeleted:
          return false;
        case kCorrupt:
          state->s =
              Status::Corruption("corrupted key for ", state->saver.user_key);
          state->found = true;
          return false;
      }

      // Not reached. Added to avoid false compilation warnings of
      // "control reaches end of non-void function".
      return false;
    }
  };

  State state;
  state.found = false;
  state.stats = stats;
  state.last_file_read = nullptr;
  state.last_file_read_level = -1;

  state.options = &options;
  state.ikey = k.internal_key();
  state.vset = vset_;

  state.saver.state = kNotFound;
  state.saver.ucmp = vset_->icmp_.user_comparator();
  state.saver.user_key = k.user_key();
  state.saver.value = value;

  ForEachOverlapping(state.saver.user_key, state.ikey, &state, &State::Match);

  return state.found ? state.s : Status::NotFound(Slice());
}